

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void destroy_tractor_beams(Am_Object *ship_obj)

{
  Am_Slot_Key AVar1;
  byte bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value_List local_40 [8];
  Am_Value_List beams;
  Am_Object local_20;
  Am_Object other_ship;
  Am_Object beam;
  Am_Object *ship_obj_local;
  
  Am_Object::Am_Object(&other_ship);
  Am_Object::Am_Object(&local_20);
  Am_Value_List::Am_Value_List(local_40);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)ship_obj,(ulong)TB_LIST);
  Am_Value_List::operator=(local_40,pAVar3);
  Am_Value_List::Start();
  while (bVar2 = Am_Value_List::Last(), AVar1 = TB_LIST, ((bVar2 ^ 0xff) & 1) != 0) {
    pAVar3 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&other_ship,pAVar3);
    pAVar3 = (Am_Value *)Am_Object::Get((ushort)&other_ship,(ulong)TB_SOURCE);
    Am_Object::operator=(&local_20,pAVar3);
    bVar2 = Am_Object::operator==(&local_20,(Am_Object *)ship_obj);
    if ((bVar2 & 1) != 0) {
      pAVar3 = (Am_Value *)Am_Object::Get((ushort)&other_ship,(ulong)TB_DEST);
      Am_Object::operator=(&local_20,pAVar3);
    }
    Am_Object::Am_Object(&local_48,(Am_Object *)&other_ship);
    Am_Object::Am_Object(&local_50,(Am_Object *)&local_20);
    remove_tractor_beam_from_ship(&local_48,&local_50);
    Am_Object::~Am_Object(&local_50);
    Am_Object::~Am_Object(&local_48);
    Am_Value_List::Delete(SUB81(local_40,0));
    Am_Object::Destroy();
    Am_Value_List::Next();
  }
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(local_40);
  Am_Object::Set((ushort)ship_obj,(Am_Wrapper *)(ulong)AVar1,(ulong)pAVar4);
  Am_Value_List::~Am_Value_List(local_40);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&other_ship);
  return;
}

Assistant:

void
destroy_tractor_beams(Am_Object ship_obj)
{
  Am_Object beam, other_ship;
  Am_Value_List beams;
  beams = ship_obj.Get(TB_LIST);
  for (beams.Start(); !beams.Last(); beams.Next()) {
    beam = beams.Get();

    // Remove tractor beam from the value list of its other attached ship
    other_ship = beam.Get(TB_SOURCE);
    if (other_ship == ship_obj)
      // Oops, ship_obj was the source, we meant to get TB_DEST
      other_ship = beam.Get(TB_DEST);
    remove_tractor_beam_from_ship(beam, other_ship);

    beams.Delete(); // remove the current beam from my list
    beam.Destroy(); // destroy the actual beam object
  }
  ship_obj.Set(TB_LIST, beams); //beams should now be empty
}